

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O1

string * CLI::NonexistentPath(string *__return_storage_ptr__,string *filename)

{
  int iVar1;
  stat buffer;
  stat local_a0;
  
  iVar1 = stat((filename->_M_dataplus)._M_p,&local_a0);
  if (iVar1 == 0) {
    ::std::operator+(__return_storage_ptr__,"Path already exists: ",filename);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string NonexistentPath(const std::string &filename) {
    struct stat buffer;
    bool exist = stat(filename.c_str(), &buffer) == 0;
    if(exist) {
        return "Path already exists: " + filename;
    }
    return std::string();
}